

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O1

int imcomp_init_table(fitsfile *outfptr,int inbitpix,int naxis,long *naxes,int writebitpix,
                     int *status)

{
  float fVar1;
  int iVar2;
  FITSfile *pFVar3;
  long lVar4;
  double dVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  char *value;
  uint uVar13;
  char *pcVar14;
  LONGLONG LVar15;
  int iVar16;
  bool bVar17;
  char zcmptype [12];
  char tf0 [4];
  long actual_tilesize [6];
  char tf2 [4];
  char tf1 [4];
  char *tform [3];
  char comm [73];
  char *tunit [3];
  char *ttype [3];
  char keyname [75];
  
  ttype[2] = "ZZERO";
  ttype[0] = "COMPRESSED_DATA";
  ttype[1] = "ZSCALE";
  tunit[2] = "";
  tunit[0] = "";
  tunit[1] = "";
  if (0 < *status) {
    return *status;
  }
  if (inbitpix < 0) {
    fVar1 = outfptr->Fptr->request_quantize_level;
    if (((fVar1 == 9999.0) && (!NAN(fVar1))) && (1 < outfptr->Fptr->request_compress_type - 0x15U))
    {
      pcVar14 = "Lossless compression of floating point images must use GZIP (imcomp_init_table)";
      goto LAB_001c6a87;
    }
  }
  pFVar3 = outfptr->Fptr;
  if (pFVar3->request_compress_type == 0) {
    pFVar3->request_compress_type = 0xb;
  }
  if (inbitpix < 0) {
    fVar1 = pFVar3->request_quantize_level;
    if ((fVar1 != 9999.0) || (NAN(fVar1))) {
      if (pFVar3->request_quantize_method == 0) {
        pFVar3->request_quantize_method = 1;
      }
      if ((fVar1 == 0.0) && (!NAN(fVar1))) {
        pFVar3->request_quantize_level =
             *(float *)(&DAT_00218928 + (ulong)(pFVar3->request_quantize_method == -1) * 4);
      }
    }
  }
  iVar16 = 0x10;
  if (inbitpix != 0x14) {
    if (inbitpix == 0x28) {
      iVar16 = 0x20;
    }
    else {
      iVar16 = inbitpix;
      if (inbitpix == 10) {
        iVar16 = 8;
      }
    }
  }
  actual_tilesize[0] = pFVar3->request_tilesize[0];
  actual_tilesize[1] = pFVar3->request_tilesize[1];
  actual_tilesize[4] = pFVar3->request_tilesize[4];
  actual_tilesize[5] = pFVar3->request_tilesize[5];
  actual_tilesize[2] = pFVar3->request_tilesize[2];
  actual_tilesize[3] = pFVar3->request_tilesize[3];
  iVar2 = pFVar3->request_compress_type;
  if (iVar2 == 0x29) {
    if (naxis < 2) {
      pcVar14 = "Hcompress cannot be used with 1-dimensional images (imcomp_init_table)";
      goto LAB_001c6a87;
    }
    uVar7 = (ulong)(uint)naxis;
    uVar9 = 0;
    uVar10 = 0;
    do {
      uVar10 = uVar10 + (3 < naxes[uVar9]);
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
    if (uVar10 < 2) {
      pcVar14 = "Hcompress minimum image dimension is 4 pixels (imcomp_init_table)";
      goto LAB_001c6a87;
    }
    if ((ulong)actual_tilesize[1] < 2) {
      uVar9 = 2;
      do {
        uVar11 = uVar9;
        if (uVar7 == uVar11) break;
        uVar9 = uVar11 + 1;
      } while ((ulong)actual_tilesize[uVar11] < 2);
      bVar17 = uVar7 <= uVar11;
    }
    else {
      bVar17 = false;
    }
    if ((actual_tilesize[0] < 1) && (actual_tilesize[1] == 0xffffffffffffffff)) {
      actual_tilesize[0] = *naxes;
      actual_tilesize[1] = naxes[1];
      if (naxis != 2) {
        uVar7 = 3;
        if (3 < naxis) {
          uVar7 = (ulong)(uint)naxis;
        }
        uVar9 = 2;
        do {
          actual_tilesize[uVar9] = 1;
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
      }
    }
    else if (bVar17 && actual_tilesize[0] < 1) {
      actual_tilesize[0] = *naxes;
      uVar7 = naxes[1];
      actual_tilesize[1] = uVar7;
      if ((((((0x1e < (long)uVar7) &&
             (actual_tilesize[1] = 0x10, 0xfffffffffffffffc < (ulong)((uint)uVar7 & 0xf) - 4)) &&
            (actual_tilesize[1] = 0x18,
            0xfffffffffffffffc < (uVar7 + (uVar7 / 3 & 0xfffffffffffffff8) * -3) - 4)) &&
           ((actual_tilesize[1] = 0x14,
            0xfffffffffffffffc < (uVar7 + (uVar7 / 5 & 0xfffffffffffffffc) * -5) - 4 &&
            (actual_tilesize[1] = 0x1e, 0xfffffffffffffffc < uVar7 % 0x1e - 4)))) &&
          ((actual_tilesize[1] = 0x1c, 0xfffffffffffffffc < uVar7 % 0x1c - 4 &&
           ((actual_tilesize[1] = 0x1a, 0xfffffffffffffffc < uVar7 % 0x1a - 4 &&
            (actual_tilesize[1] = 0x16, 0xfffffffffffffffc < uVar7 % 0x16 - 4)))))) &&
         (actual_tilesize[1] = 0x12,
         0xfffffffffffffffc < (uVar7 + (uVar7 / 9 & 0xfffffffffffffffe) * -9) - 4)) {
        actual_tilesize[1] = (ulong)(0xfffffffffffffffc < uVar7 % 0xe - 4) * 3 + 0xe;
      }
    }
    else {
      if (actual_tilesize[0] < 1) {
        actual_tilesize[0] = *naxes;
      }
      uVar7 = 2;
      if (2 < naxis) {
        uVar7 = (ulong)(uint)naxis;
      }
      uVar9 = 1;
      do {
        if (actual_tilesize[uVar9] < 0) {
          lVar12 = naxes[uVar9];
LAB_001c6540:
          actual_tilesize[uVar9] = lVar12;
        }
        else if (actual_tilesize[uVar9] == 0) {
          lVar12 = 1;
          goto LAB_001c6540;
        }
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
    }
    uVar7 = 1;
    if (1 < naxis) {
      uVar7 = (ulong)(uint)naxis;
    }
    uVar10 = 0xffffffff;
    uVar9 = 0;
    uVar13 = 0xffffffff;
    do {
      uVar6 = uVar13;
      if (((1 < actual_tilesize[uVar9]) && (uVar6 = (uint)uVar9, -1 < (int)uVar13)) &&
         (bVar17 = -1 < (int)uVar10, uVar6 = uVar13, uVar10 = (uint)uVar9, bVar17)) {
        pcVar14 = "Hcompress tiles can only have 2 dimensions (imcomp_init_table)";
        goto LAB_001c6a87;
      }
      uVar13 = uVar6;
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
    if ((int)(uVar13 | uVar10) < 0) {
      pcVar14 = "Hcompress tiles must have 2 dimensions (imcomp_init_table)";
      goto LAB_001c6a87;
    }
    lVar12 = actual_tilesize[uVar13];
    if ((lVar12 < 4) || (actual_tilesize[uVar10] < 4)) {
      pcVar14 = "Hcompress minimum tile dimension is 4 pixels (imcomp_init_table)";
      goto LAB_001c6a87;
    }
    lVar4 = naxes[uVar13];
    iVar8 = (int)(lVar4 % lVar12);
    if (iVar8 - 1U < 3) {
      dVar5 = ceil((double)iVar8 / (double)(int)(lVar4 / lVar12));
      actual_tilesize[uVar13] = lVar12 + (int)dVar5;
      if ((int)(lVar4 % (lVar12 + (int)dVar5)) - 1U < 3) {
        pcVar14 = "Last tile along 1st dimension has less than 4 pixels (imcomp_init_table)";
        goto LAB_001c6a87;
      }
    }
    lVar12 = naxes[uVar10];
    lVar4 = actual_tilesize[uVar10];
    iVar8 = (int)(lVar12 % lVar4);
    if (iVar8 - 1U < 3) {
      dVar5 = ceil((double)iVar8 / (double)(int)(lVar12 / lVar4));
      actual_tilesize[uVar10] = lVar4 + (int)dVar5;
      if ((int)(lVar12 % (lVar4 + (int)dVar5)) - 1U < 3) {
        pcVar14 = "Last tile along 2nd dimension has less than 4 pixels (imcomp_init_table)";
        goto LAB_001c6a87;
      }
    }
  }
  uVar7 = (ulong)(uint)naxis;
  if (0 < naxis) {
    uVar9 = 0;
    do {
      if (uVar9 == 0) {
        if (actual_tilesize[0] < 1) {
          actual_tilesize[0] = *naxes;
        }
      }
      else if (actual_tilesize[uVar9] < 0) {
        actual_tilesize[uVar9] = naxes[uVar9];
      }
      else if (actual_tilesize[uVar9] == 0) {
        actual_tilesize[uVar9] = 1;
      }
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  tf0 = (char  [4])((uint)(pFVar3->request_huge_hdu != 0) << 8 | 0x425031);
  tf1[0] = '1';
  tf1[1] = 'D';
  tf1[2] = '\0';
  tf2[0] = '1';
  tf2[1] = 'D';
  tf2[2] = '\0';
  tform[0] = tf0;
  tform[1] = tf1;
  tform[2] = tf2;
  if (naxis < 1) {
    LVar15 = 1;
  }
  else {
    LVar15 = 1;
    uVar9 = 0;
    do {
      LVar15 = LVar15 * ((naxes[uVar9] + -1) / actual_tilesize[uVar9] + 1);
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  if (iVar16 < 0) {
    iVar8 = 3;
    if ((pFVar3->request_quantize_level == 9999.0) && (!NAN(pFVar3->request_quantize_level)))
    goto LAB_001c69a3;
  }
  else {
LAB_001c69a3:
    iVar8 = 1;
  }
  if (iVar2 < 0x16) {
    if (iVar2 == -1) {
      builtin_strncpy(zcmptype,"NOCOMPRESS",0xb);
    }
    else {
      if (iVar2 != 0xb) {
        if (iVar2 != 0x15) goto LAB_001c6a80;
        zcmptype[4] = '_';
        zcmptype[5] = '1';
        zcmptype[6] = '\0';
        goto LAB_001c6aaf;
      }
      builtin_strncpy(zcmptype,"RICE_1",7);
    }
  }
  else if (iVar2 < 0x29) {
    if (iVar2 == 0x16) {
      zcmptype[4] = '_';
      zcmptype[5] = '2';
      zcmptype[6] = '\0';
LAB_001c6aaf:
      zcmptype[4] = (char)zcmptype._4_3_;
      zcmptype[5] = SUB31(zcmptype._4_3_,1);
      zcmptype[6] = SUB31(zcmptype._4_3_,2);
      builtin_strncpy(zcmptype,"GZIP",4);
    }
    else {
      if (iVar2 != 0x1f) {
LAB_001c6a80:
        pcVar14 = "unknown compression type (imcomp_init_table)";
LAB_001c6a87:
        ffpmsg(pcVar14);
        *status = 0x19d;
        return 0x19d;
      }
      builtin_strncpy(zcmptype,"PLIO_1",7);
      if (pFVar3->request_huge_hdu == 0) {
        builtin_strncpy(tf0,"1PI",4);
      }
      else {
        builtin_strncpy(tf0,"1QI",4);
      }
    }
  }
  else if (iVar2 == 0x29) {
    builtin_strncpy(zcmptype,"HCOMPRESS_1",0xc);
  }
  else {
    if (iVar2 != 0x33) goto LAB_001c6a80;
    builtin_strncpy(zcmptype,"BZIP2_1",8);
  }
  iVar2 = outfptr->Fptr->curhdu;
  ffcrtb(outfptr,2,LVar15,iVar8,ttype,tform,tunit,(char *)0x0,status);
  ffpkyl(outfptr,"ZIMAGE",1,"extension contains compressed image",status);
  if (writebitpix != 0) {
    if (iVar2 == 0) {
      ffpkyl(outfptr,"ZSIMPLE",1,"file does conform to FITS standard",status);
    }
    ffpkyj(outfptr,"ZBITPIX",(long)iVar16,"data type of original image",status);
    ffpkyj(outfptr,"ZNAXIS",(long)naxis,"dimension of original image",status);
    if (0 < naxis) {
      uVar9 = 0;
      do {
        uVar11 = uVar9 + 1;
        snprintf(keyname,0x4b,"ZNAXIS%d",uVar11 & 0xffffffff);
        ffpkyj(outfptr,keyname,naxes[uVar9],"length of original image axis",status);
        uVar9 = uVar11;
      } while (uVar7 != uVar11);
    }
  }
  if (0 < naxis) {
    uVar9 = 0;
    do {
      uVar11 = uVar9 + 1;
      snprintf(keyname,0x4b,"ZTILE%d",uVar11 & 0xffffffff);
      ffpkyj(outfptr,keyname,actual_tilesize[uVar9],"size of tiles to be compressed",status);
      uVar9 = uVar11;
    } while (uVar7 != uVar11);
  }
  if (iVar16 < 0) {
    pFVar3 = outfptr->Fptr;
    if ((pFVar3->request_quantize_level != 9999.0) || (NAN(pFVar3->request_quantize_level))) {
      if (pFVar3->request_quantize_method == 0) {
        pFVar3->request_quantize_method = 1;
      }
      if ((pFVar3->request_quantize_method == 2) &&
         (CONCAT13(zcmptype[0xb],CONCAT21(zcmptype._9_2_,zcmptype[8])) == 0x315f53 &&
          CONCAT44(zcmptype._4_4_,zcmptype._0_4_) == 0x534552504d4f4348)) {
        imcomp_init_table_cold_1();
      }
      iVar2 = outfptr->Fptr->request_quantize_method;
      if (iVar2 != -1) {
        if (iVar2 == 2) {
          ffpkys(outfptr,"ZQUANTIZ","SUBTRACTIVE_DITHER_2","Pixel Quantization Algorithm",status);
          ffpky(outfptr,0x1f,"ZDITHER0",&outfptr->Fptr->request_dither_seed,
                "dithering offset when quantizing floats",status);
          if (CONCAT31(zcmptype._4_3_,zcmptype[3]) == 0x315f45 && zcmptype._0_4_ == 0x45434952) {
            builtin_strncpy(zcmptype,"RICE_ONE",9);
          }
        }
        else if (iVar2 == 1) {
          ffpkys(outfptr,"ZQUANTIZ","SUBTRACTIVE_DITHER_1","Pixel Quantization Algorithm",status);
          ffpky(outfptr,0x1f,"ZDITHER0",&outfptr->Fptr->request_dither_seed,
                "dithering offset when quantizing floats",status);
        }
        goto LAB_001c6cbd;
      }
      value = "NO_DITHER";
      pcVar14 = "No dithering during quantization";
    }
    else {
      value = "NONE";
      pcVar14 = "Lossless compression without quantization";
    }
    ffpkys(outfptr,"ZQUANTIZ",value,pcVar14,status);
  }
LAB_001c6cbd:
  ffpkys(outfptr,"ZCMPTYPE",zcmptype,"compression algorithm",status);
  iVar2 = outfptr->Fptr->request_compress_type;
  if (iVar2 == 0x29) {
    ffpkys(outfptr,"ZNAME1","SCALE","HCOMPRESS scale factor",status);
    ffpkye(outfptr,"ZVAL1",outfptr->Fptr->request_hcomp_scale,7,"HCOMPRESS scale factor",status);
    ffpkys(outfptr,"ZNAME2","SMOOTH","HCOMPRESS smooth option",status);
    LVar15 = (LONGLONG)outfptr->Fptr->request_hcomp_smooth;
    pcVar14 = "HCOMPRESS smooth option";
LAB_001c6eca:
    ffpkyj(outfptr,"ZVAL2",LVar15,pcVar14,status);
  }
  else if (iVar2 == 0xb) {
    ffpkys(outfptr,"ZNAME1","BLOCKSIZE","compression block size",status);
    ffpkyj(outfptr,"ZVAL1",0x20,"pixels per block",status);
    ffpkys(outfptr,"ZNAME2","BYTEPIX","bytes per pixel (1, 2, 4, or 8)",status);
    pcVar14 = "bytes per pixel (1, 2, 4, or 8)";
    if (iVar16 == 0x10) {
      LVar15 = 2;
    }
    else if (iVar16 == 8) {
      LVar15 = 1;
    }
    else {
      LVar15 = 4;
    }
    goto LAB_001c6eca;
  }
  if (inbitpix == 0x14) {
    builtin_strncpy(comm + 0x1c," unsigned short",0x10);
    uVar10 = 0x40e00000;
  }
  else if (inbitpix == 0x28) {
    builtin_strncpy(comm + 0x1c," unsigned long",0xf);
    uVar10 = 0x41e00000;
  }
  else {
    if (inbitpix != 10) goto LAB_001c6fe3;
    builtin_strncpy(comm + 0x1c," signed byte",0xd);
    uVar10 = 0xc0600000;
  }
  builtin_strncpy(comm,"offset data range to that of",0x1c);
  ffpkyg(outfptr,"BZERO",(double)((ulong)uVar10 << 0x20),0,comm,status);
  builtin_strncpy(comm,"default scaling factor",0x17);
  ffpkyg(outfptr,"BSCALE",1.0,0,comm,status);
LAB_001c6fe3:
  return *status;
}

Assistant:

int imcomp_init_table(fitsfile *outfptr,
        int inbitpix,
        int naxis,
        long *naxes,
	int writebitpix,    /* write the ZBITPIX, ZNAXIS, and ZNAXES keyword? */
        int *status)
/* 
  create a BINTABLE extension for the output compressed image.
*/
{
    char keyname[FLEN_KEYWORD], zcmptype[12];
    int ii,  remain,  ndiv, addToDim, ncols, bitpix;
    long nrows;
    char *ttype[] = {"COMPRESSED_DATA", "ZSCALE", "ZZERO"};
    char *tform[3];
    char tf0[4], tf1[4], tf2[4];
    char *tunit[] = {"\0",            "\0",            "\0"  };
    char comm[FLEN_COMMENT];
    long actual_tilesize[MAX_COMPRESS_DIM]; /* Actual size to use for tiles */
    int is_primary=0; /* Is this attempting to write to the primary? */
    int nQualifyDims=0; /* For Hcompress, number of image dimensions with required pixels. */
    int noHigherDims=1; /* Set to true if all tile dims other than x are size 1. */
    int firstDim=-1, secondDim=-1; /* Indices of first and second tiles dimensions
                                with width > 1 */
    
    if (*status > 0)
        return(*status);

    /* check for special case of losslessly compressing floating point */
    /* images.  Only compression algorithm that supports this is GZIP */
    if ( (inbitpix < 0) && ((outfptr->Fptr)->request_quantize_level == NO_QUANTIZE) ) {
       if (((outfptr->Fptr)->request_compress_type != GZIP_1) &&
           ((outfptr->Fptr)->request_compress_type != GZIP_2)) {
         ffpmsg("Lossless compression of floating point images must use GZIP (imcomp_init_table)");
         return(*status = DATA_COMPRESSION_ERR);
       }
    }
 
     /* set default compression parameter values, if undefined */
    
    if ( (outfptr->Fptr)->request_compress_type == 0) {
	/* use RICE_1 by default */
	(outfptr->Fptr)->request_compress_type = RICE_1;
    }

    if (inbitpix < 0 && (outfptr->Fptr)->request_quantize_level != NO_QUANTIZE) {  
	/* set defaults for quantizing floating point images */
	if ( (outfptr->Fptr)->request_quantize_method == 0) {
	      /* set default dithering method */
              (outfptr->Fptr)->request_quantize_method = SUBTRACTIVE_DITHER_1;
	}

	if ( (outfptr->Fptr)->request_quantize_level == 0) {
	    if ((outfptr->Fptr)->request_quantize_method == NO_DITHER) {
	        /* must use finer quantization if no dithering is done */
	        (outfptr->Fptr)->request_quantize_level = 16; 
	    } else {
	        (outfptr->Fptr)->request_quantize_level = 4; 
	    }
        }
    }

    /* special case: the quantization level is not given by a keyword in  */
    /* the HDU header, so we have to explicitly copy the requested value */
    /* to the actual value */
/* do this in imcomp_get_compressed_image_par, instead
    if ( (outfptr->Fptr)->request_quantize_level != 0.)
        (outfptr->Fptr)->quantize_level = (outfptr->Fptr)->request_quantize_level;
*/
    /* test for the 2 special cases that represent unsigned integers */
    if (inbitpix == USHORT_IMG)
        bitpix = SHORT_IMG;
    else if (inbitpix == ULONG_IMG)
        bitpix = LONG_IMG;
    else if (inbitpix == SBYTE_IMG)
        bitpix = BYTE_IMG;
    else 
        bitpix = inbitpix;

    /* reset default tile dimensions too if required */
    memcpy(actual_tilesize, outfptr->Fptr->request_tilesize, MAX_COMPRESS_DIM * sizeof(long));

    if ((outfptr->Fptr)->request_compress_type == HCOMPRESS_1) {
         
         /* Tiles must ultimately have 2 (and only 2) dimensions, each with
             at least 4 pixels. First catch the case where the image
             itself won't allow this. */
         if (naxis < 2 ) {
            ffpmsg("Hcompress cannot be used with 1-dimensional images (imcomp_init_table)");
            return(*status = DATA_COMPRESSION_ERR);
	 }
         for (ii=0; ii<naxis; ii++)
         {
            if (naxes[ii] >= 4)
               ++nQualifyDims;
         }
         if (nQualifyDims < 2)
         {
            ffpmsg("Hcompress minimum image dimension is 4 pixels (imcomp_init_table)");
            return(*status = DATA_COMPRESSION_ERR);            
         }

         /* Handle 2 special cases for backwards compatibility.
            1) If both X and Y tile dims are set to full size, ignore
               any other requested dimensions and just set their sizes to 1. 
            2) If X is full size and all the rest are size 1, attempt to
               find a reasonable size for Y. All other 1-D tile specifications
               will be rejected. */
         for (ii=1; ii<naxis; ++ii)
            if (actual_tilesize[ii] != 0 && actual_tilesize[ii] != 1)
            {
               noHigherDims = 0;
               break;
            }

         if ((actual_tilesize[0] <= 0) &&
             (actual_tilesize[1] == -1) ){
	     
	    /* compress the whole image as a single tile */
             actual_tilesize[0] = naxes[0];
             actual_tilesize[1] = naxes[1];

              for (ii = 2; ii < naxis; ii++) {
	             /* set all higher tile dimensions = 1 */
                     actual_tilesize[ii] = 1;
	      }

         } else if ((actual_tilesize[0] <= 0) && noHigherDims) {
	     
             /*
              The Hcompress algorithm is inherently 2D in nature, so the row by row
	      tiling that is used for other compression algorithms is not appropriate.
	      If the image has less than 30 rows, then the entire image will be compressed
	      as a single tile.  Otherwise the tiles will consist of 16 rows of the image. 
	      This keeps the tiles to a reasonable size, and it also includes enough rows
	      to allow good compression efficiency.  If the last tile of the image 
	      happens to contain less than 4 rows, then find another tile size with
	      between 14 and 30 rows (preferably even), so that the last tile has 
	      at least 4 rows
	     */ 
	      
             /* 1st tile dimension is the row length of the image */
             actual_tilesize[0] = naxes[0];

              if (naxes[1] <= 30) {  /* use whole image if it is small */
                   actual_tilesize[1] = naxes[1];
	      } else {
                /* look for another good tile dimension */
	          if        (naxes[1] % 16 == 0 || naxes[1] % 16 > 3) {
                      actual_tilesize[1] = 16;
		  } else if (naxes[1] % 24 == 0 || naxes[1] % 24 > 3) {
                      actual_tilesize[1] = 24;
		  } else if (naxes[1] % 20 == 0 || naxes[1] % 20 > 3) {
                      actual_tilesize[1] = 20;
		  } else if (naxes[1] % 30 == 0 || naxes[1] % 30 > 3) {
                      actual_tilesize[1] = 30;
		  } else if (naxes[1] % 28 == 0 || naxes[1] % 28 > 3) {
                      actual_tilesize[1] = 28;
		  } else if (naxes[1] % 26 == 0 || naxes[1] % 26 > 3) {
                      actual_tilesize[1] = 26;
		  } else if (naxes[1] % 22 == 0 || naxes[1] % 22 > 3) {
                      actual_tilesize[1] = 22;
		  } else if (naxes[1] % 18 == 0 || naxes[1] % 18 > 3) {
                      actual_tilesize[1] = 18;
		  } else if (naxes[1] % 14 == 0 || naxes[1] % 14 > 3) {
                      actual_tilesize[1] = 14;
		  } else  {
                      actual_tilesize[1] = 17;
		  }
	      }
        } else {
           if (actual_tilesize[0] <= 0)
              actual_tilesize[0] = naxes[0];
           for (ii=1; ii<naxis; ++ii)
           {
              if (actual_tilesize[ii] < 0)
                 actual_tilesize[ii] = naxes[ii];
              else if (actual_tilesize[ii] == 0)
                 actual_tilesize[ii] = 1;
           }
        }
        
        for (ii=0; ii<naxis; ++ii)
        {
           if (actual_tilesize[ii] > 1)
           {
              if (firstDim < 0)
                 firstDim = ii;
              else if (secondDim < 0)
                 secondDim = ii;
              else
              {
                 ffpmsg("Hcompress tiles can only have 2 dimensions (imcomp_init_table)");
                 return(*status = DATA_COMPRESSION_ERR);
              }
           }
        }
        if (firstDim < 0 || secondDim < 0)
        {
            ffpmsg("Hcompress tiles must have 2 dimensions (imcomp_init_table)");
            return(*status = DATA_COMPRESSION_ERR);
        }
        
        if (actual_tilesize[firstDim] < 4 || actual_tilesize[secondDim] < 4)
        {
           ffpmsg("Hcompress minimum tile dimension is 4 pixels (imcomp_init_table)");
           return (*status = DATA_COMPRESSION_ERR);
        }
	
        /* check if requested tile size causes the last tile to to have less than 4 pixels */
        remain = naxes[firstDim] % (actual_tilesize[firstDim]);  /* 1st dimension */
        if (remain > 0 && remain < 4) {
            ndiv = naxes[firstDim]/actual_tilesize[firstDim]; /* integer truncation is intentional */
            addToDim = ceil((double)remain/ndiv);
            (actual_tilesize[firstDim]) += addToDim; /* increase tile size */
	   
            remain = naxes[firstDim] % (actual_tilesize[firstDim]);
            if (remain > 0 && remain < 4) {
                ffpmsg("Last tile along 1st dimension has less than 4 pixels (imcomp_init_table)");
                return(*status = DATA_COMPRESSION_ERR);	
            }        
        }

        remain = naxes[secondDim] % (actual_tilesize[secondDim]);  /* 2nd dimension */
        if (remain > 0 && remain < 4) {
            ndiv = naxes[secondDim]/actual_tilesize[secondDim]; /* integer truncation is intentional */
            addToDim = ceil((double)remain/ndiv);
            (actual_tilesize[secondDim]) += addToDim; /* increase tile size */
	   
            remain = naxes[secondDim] % (actual_tilesize[secondDim]);
            if (remain > 0 && remain < 4) {
                ffpmsg("Last tile along 2nd dimension has less than 4 pixels (imcomp_init_table)");
                return(*status = DATA_COMPRESSION_ERR);	
            }        
        }

    } /* end, if HCOMPRESS_1 */
    
    for (ii = 0; ii < naxis; ii++) {
	if (ii == 0) { /* first axis is different */
	    if (actual_tilesize[ii] <= 0) {
                actual_tilesize[ii] = naxes[ii]; 
	    }
	} else {
	    if (actual_tilesize[ii] < 0) {
                actual_tilesize[ii] = naxes[ii];  /* negative value maean use whole length */
	    } else if (actual_tilesize[ii] == 0) {
                actual_tilesize[ii] = 1;  /* zero value means use default value = 1 */
	    }
	}
    }

    /* ---- set up array of TFORM strings -------------------------------*/
    if ( (outfptr->Fptr)->request_huge_hdu != 0) {
        strcpy(tf0, "1QB");
    } else {
        strcpy(tf0, "1PB");
    }
    strcpy(tf1, "1D");
    strcpy(tf2, "1D");

    tform[0] = tf0;
    tform[1] = tf1;
    tform[2] = tf2;

    /* calculate number of rows in output table */
    nrows = 1;
    for (ii = 0; ii < naxis; ii++)
    {
        nrows = nrows * ((naxes[ii] - 1)/ (actual_tilesize[ii]) + 1);
    }

    /* determine the default  number of columns in the output table */
    if (bitpix < 0 && (outfptr->Fptr)->request_quantize_level != NO_QUANTIZE)  
        ncols = 3;  /* quantized and scaled floating point image */
    else
        ncols = 1; /* default table has just one 'COMPRESSED_DATA' column */

    if ((outfptr->Fptr)->request_compress_type == RICE_1)
    {
        strcpy(zcmptype, "RICE_1");
    }
    else if ((outfptr->Fptr)->request_compress_type == GZIP_1)
    {
        strcpy(zcmptype, "GZIP_1");
    }
    else if ((outfptr->Fptr)->request_compress_type == GZIP_2)
    {
        strcpy(zcmptype, "GZIP_2");
    }
    else if ((outfptr->Fptr)->request_compress_type == BZIP2_1)
    {
        strcpy(zcmptype, "BZIP2_1");
    }
    else if ((outfptr->Fptr)->request_compress_type == PLIO_1)
    {
        strcpy(zcmptype, "PLIO_1");
       /* the PLIO compression algorithm outputs short integers, not bytes */
        if ( (outfptr->Fptr)->request_huge_hdu != 0) {
            strcpy(tform[0], "1QI");
        } else {
            strcpy(tform[0], "1PI");
        }
    }
    else if ((outfptr->Fptr)->request_compress_type == HCOMPRESS_1)
    {
        strcpy(zcmptype, "HCOMPRESS_1");
    }
    else if ((outfptr->Fptr)->request_compress_type == NOCOMPRESS)
    {
        strcpy(zcmptype, "NOCOMPRESS");
    }    
    else
    {
        ffpmsg("unknown compression type (imcomp_init_table)");
        return(*status = DATA_COMPRESSION_ERR);
    }

    /* If attempting to write compressed image to primary, the
       call to ffcrtb will increment Fptr->curhdu to 1.  Therefore
       we need to test now for setting is_primary */
    is_primary = (outfptr->Fptr->curhdu == 0);
    /* create the bintable extension to contain the compressed image */
    ffcrtb(outfptr, BINARY_TBL, nrows, ncols, ttype, 
                tform, tunit, 0, status);

    /* Add standard header keywords. */
    ffpkyl (outfptr, "ZIMAGE", 1, 
           "extension contains compressed image", status);  

    if (writebitpix) {
        /*  write the keywords defining the datatype and dimensions of */
	/*  the uncompressed image.  If not, these keywords will be */
        /*  copied later from the input uncompressed image  */
	
        if (is_primary)   
            ffpkyl (outfptr, "ZSIMPLE", 1,
			"file does conform to FITS standard", status);
        ffpkyj (outfptr, "ZBITPIX", bitpix,
			"data type of original image", status);
        ffpkyj (outfptr, "ZNAXIS", naxis,
			"dimension of original image", status);

        for (ii = 0;  ii < naxis;  ii++)
        {
            snprintf (keyname, FLEN_KEYWORD,"ZNAXIS%d", ii+1);
            ffpkyj (outfptr, keyname, naxes[ii],
			"length of original image axis", status);
        }
    }
                      
    for (ii = 0;  ii < naxis;  ii++)
    {
        snprintf (keyname, FLEN_KEYWORD,"ZTILE%d", ii+1);
        ffpkyj (outfptr, keyname, actual_tilesize[ii],
			"size of tiles to be compressed", status);
    }

    if (bitpix < 0) {
       
	if ((outfptr->Fptr)->request_quantize_level == NO_QUANTIZE) {
	    ffpkys(outfptr, "ZQUANTIZ", "NONE", 
	      "Lossless compression without quantization", status);
	} else {
	    
	    /* Unless dithering has been specifically turned off by setting */
	    /* request_quantize_method = -1, use dithering by default */
	    /* when quantizing floating point images. */
	
	    if ( (outfptr->Fptr)->request_quantize_method == 0) 
              (outfptr->Fptr)->request_quantize_method = SUBTRACTIVE_DITHER_1;
            
            /* HCompress must not use SUBTRACTIVE_DITHER_2. If user is requesting
               this, assign SUBTRACTIVE_DITHER_1 instead. */
            if ((outfptr->Fptr)->request_quantize_method == SUBTRACTIVE_DITHER_2
              && !(strcmp(zcmptype,"HCOMPRESS_1"))) {
                 (outfptr->Fptr)->request_quantize_method = SUBTRACTIVE_DITHER_1;
               fprintf(stderr,"Warning: CFITSIO does not allow subtractive_dither_2 when using Hcompress algorithm.\nWill use subtractive_dither_1 instead.\n");
            }
                 
	    if ((outfptr->Fptr)->request_quantize_method == SUBTRACTIVE_DITHER_1) {
	      ffpkys(outfptr, "ZQUANTIZ", "SUBTRACTIVE_DITHER_1", 
	        "Pixel Quantization Algorithm", status);

	      /* also write the associated ZDITHER0 keyword with a default value */
	      /* which may get updated later. */
              ffpky(outfptr, TINT, "ZDITHER0", &((outfptr->Fptr)->request_dither_seed), 
	       "dithering offset when quantizing floats", status);
 
            } else if ((outfptr->Fptr)->request_quantize_method == SUBTRACTIVE_DITHER_2) {
	      ffpkys(outfptr, "ZQUANTIZ", "SUBTRACTIVE_DITHER_2", 
	        "Pixel Quantization Algorithm", status);

	      /* also write the associated ZDITHER0 keyword with a default value */
	      /* which may get updated later. */
              ffpky(outfptr, TINT, "ZDITHER0", &((outfptr->Fptr)->request_dither_seed), 
	       "dithering offset when quantizing floats", status);

	      if (!strcmp(zcmptype, "RICE_1"))  {
	        /* when using this new dithering method, change the compression type */
		/* to an alias, so that old versions of funpack will not be able to */
		/* created a corrupted uncompressed image. */
		/* ******* can remove this cludge after about June 2015, after most old versions of fpack are gone */
        	strcpy(zcmptype, "RICE_ONE");
	      }

            } else if ((outfptr->Fptr)->request_quantize_method == NO_DITHER) {
	      ffpkys(outfptr, "ZQUANTIZ", "NO_DITHER", 
	        "No dithering during quantization", status);
	    }

	}
    }

    ffpkys (outfptr, "ZCMPTYPE", zcmptype,
	          "compression algorithm", status);

    /* write any algorithm-specific keywords */
    if ((outfptr->Fptr)->request_compress_type == RICE_1)
    {
        ffpkys (outfptr, "ZNAME1", "BLOCKSIZE",
            "compression block size", status);

        /* for now at least, the block size is always 32 */
        ffpkyj (outfptr, "ZVAL1", 32,
			"pixels per block", status);

        ffpkys (outfptr, "ZNAME2", "BYTEPIX",
            "bytes per pixel (1, 2, 4, or 8)", status);

        if (bitpix == BYTE_IMG)
            ffpkyj (outfptr, "ZVAL2", 1,
			"bytes per pixel (1, 2, 4, or 8)", status);
        else if (bitpix == SHORT_IMG)
            ffpkyj (outfptr, "ZVAL2", 2,
			"bytes per pixel (1, 2, 4, or 8)", status);
        else 
            ffpkyj (outfptr, "ZVAL2", 4,
			"bytes per pixel (1, 2, 4, or 8)", status);

    }
    else if ((outfptr->Fptr)->request_compress_type == HCOMPRESS_1)
    {
        ffpkys (outfptr, "ZNAME1", "SCALE",
            "HCOMPRESS scale factor", status);
        ffpkye (outfptr, "ZVAL1", (outfptr->Fptr)->request_hcomp_scale,
		7, "HCOMPRESS scale factor", status);

        ffpkys (outfptr, "ZNAME2", "SMOOTH",
            "HCOMPRESS smooth option", status);
        ffpkyj (outfptr, "ZVAL2", (long) (outfptr->Fptr)->request_hcomp_smooth,
			"HCOMPRESS smooth option", status);
    }

    /* Write the BSCALE and BZERO keywords, if an unsigned integer image */
    if (inbitpix == USHORT_IMG)
    {
        strcpy(comm, "offset data range to that of unsigned short");
        ffpkyg(outfptr, "BZERO", 32768., 0, comm, status);
        strcpy(comm, "default scaling factor");
        ffpkyg(outfptr, "BSCALE", 1.0, 0, comm, status);
    }
    else if (inbitpix == SBYTE_IMG)
    {
        strcpy(comm, "offset data range to that of signed byte");
        ffpkyg(outfptr, "BZERO", -128., 0, comm, status);
        strcpy(comm, "default scaling factor");
        ffpkyg(outfptr, "BSCALE", 1.0, 0, comm, status);
    }
    else if (inbitpix == ULONG_IMG)
    {
        strcpy(comm, "offset data range to that of unsigned long");
        ffpkyg(outfptr, "BZERO", 2147483648., 0, comm, status);
        strcpy(comm, "default scaling factor");
        ffpkyg(outfptr, "BSCALE", 1.0, 0, comm, status);
    }

    return(*status);
}